

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

ParseResult * read_object(ParseResult *__return_storage_ptr__,istream *is)

{
  element_type *peVar1;
  parse_result_t pVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  ast_type_t aVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  long *plVar8;
  long *plVar9;
  bool bVar10;
  undefined8 uVar11;
  char cVar12;
  _Alloc_hider _Var13;
  _Atomic_word *s;
  string oct;
  string charname;
  undefined1 local_130 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  parse_result_t local_f8;
  element_type *local_f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_e8;
  char *local_e0;
  size_type local_d8;
  char local_d0;
  undefined7 uStack_cf;
  undefined8 uStack_c8;
  string local_c0;
  shared_ptr<ASTNode> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  this->_M_use_count = 1;
  this->_M_weak_count = 1;
  this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0016b2b0;
  peVar1 = (element_type *)(this + 1);
  *(undefined4 *)&this[1]._vptr__Sp_counted_base = 0;
  *(_Atomic_word **)&this[1]._M_use_count = &this[2]._M_use_count;
  this[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(undefined1 *)&this[2]._M_use_count = 0;
  this[4]._vptr__Sp_counted_base = (_func_int **)&this[3]._M_use_count;
  *(_Atomic_word **)&this[3]._M_use_count = &this[3]._M_use_count;
  this[4]._M_use_count = 0;
  this[4]._M_weak_count = 0;
  local_a0.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  local_a0.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this;
  skip_whitespace(is);
  iVar5 = std::istream::get();
  s = &this[1]._M_use_count;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_f8 = END;
  local_f0 = (element_type *)0x0;
  p_Stack_e8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_e0 = &local_d0;
  local_d8 = 0;
  local_d0 = '\0';
  cVar12 = (char)s;
  if (0x5a < iVar5) {
    if (iVar5 == 0x5b) goto switchD_001151ef_caseD_28;
    if (iVar5 == 0x5d) goto switchD_001151ef_caseD_29;
    if (iVar5 == 0x60) {
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"quasiquote","");
      read_quoted((ParseResult *)local_130,is,&local_a0,&local_c0);
      goto LAB_0011569b;
    }
    goto switchD_001151ef_caseD_24;
  }
  switch(iVar5) {
  case 0x22:
    peVar1->type = 4;
    iVar5 = std::istream::get();
    do {
      if (iVar5 == 0x5c) {
        uVar6 = std::istream::get();
        if ((((uVar6 == 0x66) || (uVar6 == 0x6e)) || (uVar6 == 0x74)) ||
           ((uVar6 & 0xfffffff8) != 0x30)) goto LAB_00115227;
        local_130._0_8_ = local_130 + 0x10;
        local_130._8_8_ = (element_type *)0x0;
        local_130._16_8_ = local_130._16_8_ & 0xffffffffffffff00;
        bVar4 = true;
        do {
          bVar10 = bVar4;
          std::__cxx11::string::push_back((char)local_130);
          uVar6 = std::istream::get();
          if ((uVar6 & 0xfffffff8) != 0x30) {
            std::operator+(&local_50,"Invalid escape sequence: \\",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_130);
            plVar8 = (long *)std::__cxx11::string::_M_replace_aux
                                       ((ulong)&local_50,local_50._M_string_length,0,'\x01');
            plVar9 = plVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar9) {
              local_c0.field_2._M_allocated_capacity = *plVar9;
              local_c0.field_2._8_8_ = plVar8[3];
              local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            }
            else {
              local_c0.field_2._M_allocated_capacity = *plVar9;
              local_c0._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_c0._M_string_length = plVar8[1];
            *plVar8 = (long)plVar9;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            ParseResult::ParseResult(__return_storage_ptr__,&local_c0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,
                              (ulong)(local_c0.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            goto LAB_001158ca;
          }
          bVar4 = false;
        } while (bVar10);
        std::__cxx11::string::push_back((char)local_130);
        std::__cxx11::string::push_back(cVar12);
        if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
          operator_delete((void *)local_130._0_8_,(ulong)(local_130._16_8_ + 1));
        }
      }
      else {
        if (iVar5 == -1) {
          local_130._0_8_ = local_130 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_130,"Unclosed string literal","");
          ParseResult::ParseResult(__return_storage_ptr__,(string *)local_130);
LAB_001158ca:
          if ((undefined1 *)local_130._0_8_ == local_130 + 0x10) goto LAB_00115989;
          goto LAB_001158dd;
        }
        if (iVar5 == 0x22) break;
LAB_00115227:
        std::__cxx11::string::push_back(cVar12);
      }
      iVar5 = std::istream::get();
    } while( true );
  case 0x23:
    iVar5 = std::istream::get();
    iVar5 = tolower(iVar5);
    if (0x5b < iVar5) {
      if (iVar5 == 0x5c) {
        peVar1->type = 6;
        iVar5 = std::istream::get();
        if (iVar5 == -1) {
          local_130._0_8_ = local_130 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_130,"Invalid character","");
          ParseResult::ParseResult(__return_storage_ptr__,(string *)local_130);
          goto LAB_00115478;
        }
        local_90._M_string_length = 0;
        *local_90._M_dataplus._M_p = '\0';
        std::__cxx11::string::push_back((char)&local_90);
        iVar5 = std::istream::peek();
        while (bVar4 = is_delimiter(iVar5), !bVar4) {
          std::__cxx11::string::push_back((char)&local_90);
          std::istream::get();
          iVar5 = std::istream::peek();
        }
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,local_90._M_dataplus._M_p,
                   local_90._M_dataplus._M_p + local_90._M_string_length);
        normalize_char_name((string *)local_130,&local_70);
        std::__cxx11::string::operator=((string *)s,(string *)local_130);
        if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
          operator_delete((void *)local_130._0_8_,(ulong)(local_130._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if (this[2]._vptr__Sp_counted_base == (_func_int **)0x0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_130,"Invalid character: #\\",&local_90);
          ParseResult::ParseResult(__return_storage_ptr__,(string *)local_130);
          if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
LAB_001158dd:
            operator_delete((void *)local_130._0_8_,(ulong)(local_130._16_8_ + 1));
          }
          goto LAB_00115989;
        }
      }
      else if (iVar5 == 0x66) {
        peVar1->type = 5;
        std::__cxx11::string::operator=((string *)s,"f");
      }
      else {
        if (iVar5 != 0x74) goto LAB_00115a76;
        peVar1->type = 5;
        std::__cxx11::string::operator=((string *)s,"t");
      }
      break;
    }
    if (iVar5 == 0x21) {
      std::__cxx11::string::operator=((string *)s,"#!");
      iVar5 = std::istream::get();
      goto switchD_001151ef_caseD_24;
    }
    if ((iVar5 != 0x28) && (iVar5 != 0x5b)) {
LAB_00115a76:
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Invalid sequence: #","");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                     &local_c0,(char)iVar5);
      ParseResult::ParseResult(__return_storage_ptr__,(string *)local_130);
      if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
        operator_delete((void *)local_130._0_8_,(ulong)(local_130._16_8_ + 1));
      }
      uVar11 = local_c0.field_2._M_allocated_capacity;
      _Var13._M_p = local_c0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p == &local_c0.field_2) goto LAB_00115989;
      goto LAB_00115487;
    }
    read_list((ParseResult *)local_130,is,&local_a0,iVar5 == 0x5b);
    p_Var3 = p_Stack_e8;
    p_Stack_e8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._16_8_;
    local_f0 = (element_type *)local_130._8_8_;
    local_f8 = local_130._0_4_;
    local_130._8_8_ = (element_type *)0x0;
    local_130._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    std::__cxx11::string::operator=((string *)&local_e0,(string *)(local_130 + 0x18));
    pVar2 = local_f8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._24_8_ != &local_108) {
      operator_delete((void *)local_130._24_8_,local_108._M_allocated_capacity + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._16_8_);
    }
    if (pVar2 != OK) goto LAB_001153ff;
    *(undefined4 *)&this[1]._vptr__Sp_counted_base = 7;
LAB_0011563d:
    __return_storage_ptr__->result = OK;
    (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar1;
    (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = this;
    goto LAB_00115972;
  case 0x27:
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"quote","");
    read_quoted((ParseResult *)local_130,is,&local_a0,&local_c0);
    goto LAB_0011569b;
  case 0x28:
switchD_001151ef_caseD_28:
    read_list((ParseResult *)local_130,is,&local_a0,iVar5 == 0x5b);
    p_Var3 = p_Stack_e8;
    p_Stack_e8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._16_8_;
    local_f0 = (element_type *)local_130._8_8_;
    local_f8 = local_130._0_4_;
    local_130._8_8_ = (element_type *)0x0;
    local_130._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    std::__cxx11::string::operator=((string *)&local_e0,(string *)(local_130 + 0x18));
    pVar2 = local_f8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._24_8_ != &local_108) {
      operator_delete((void *)local_130._24_8_,local_108._M_allocated_capacity + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._16_8_);
    }
    if (pVar2 == OK) goto LAB_0011563d;
LAB_001153ff:
    __return_storage_ptr__->result = local_f8;
    (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_f0;
    (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Stack_e8;
    (__return_storage_ptr__->error)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->error).field_2;
    if (local_e0 == &local_d0) goto LAB_0011543a;
    goto LAB_0011575e;
  case 0x29:
switchD_001151ef_caseD_29:
    local_130._0_8_ = local_130 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"Invalid syntax","");
    ParseResult::ParseResult(__return_storage_ptr__,(string *)local_130);
LAB_00115478:
    uVar11 = local_130._16_8_;
    _Var13._M_p = (pointer)local_130._0_8_;
    if ((undefined1 *)local_130._0_8_ == local_130 + 0x10) goto LAB_00115989;
LAB_00115487:
    operator_delete(_Var13._M_p,
                    (ulong)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar11)->
                                   _vptr__Sp_counted_base + 1));
    goto LAB_00115989;
  case 0x2c:
    iVar5 = std::istream::peek();
    if (iVar5 == 0x40) {
      std::istream::get();
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"unquote-splicing","");
      read_quoted((ParseResult *)local_130,is,&local_a0,&local_c0);
    }
    else {
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"unquote","");
      read_quoted((ParseResult *)local_130,is,&local_a0,&local_c0);
    }
LAB_0011569b:
    p_Var3 = p_Stack_e8;
    p_Stack_e8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._16_8_;
    local_f0 = (element_type *)local_130._8_8_;
    local_f8 = local_130._0_4_;
    local_130._8_8_ = (element_type *)0x0;
    local_130._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    std::__cxx11::string::operator=((string *)&local_e0,(string *)(local_130 + 0x18));
    pVar2 = local_f8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._24_8_ != &local_108) {
      operator_delete((void *)local_130._24_8_,local_108._M_allocated_capacity + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._16_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,(ulong)(local_c0.field_2._M_allocated_capacity + 1))
      ;
    }
    if (pVar2 != OK) {
      __return_storage_ptr__->result = local_f8;
      (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = local_f0;
      (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Stack_e8;
      (__return_storage_ptr__->error)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->error).field_2;
      if (local_e0 == &local_d0) {
LAB_0011543a:
        (__return_storage_ptr__->error).field_2._M_allocated_capacity = CONCAT71(uStack_cf,local_d0)
        ;
        *(undefined8 *)((long)&(__return_storage_ptr__->error).field_2 + 8) = uStack_c8;
      }
      else {
LAB_0011575e:
        (__return_storage_ptr__->error)._M_dataplus._M_p = local_e0;
        (__return_storage_ptr__->error).field_2._M_allocated_capacity = CONCAT71(uStack_cf,local_d0)
        ;
      }
      p_Stack_e8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_f0 = (element_type *)0x0;
      local_e0 = &local_d0;
      (__return_storage_ptr__->error)._M_string_length = local_d8;
      local_d8 = 0;
      local_d0 = '\0';
      goto LAB_00115989;
    }
    break;
  default:
    if (iVar5 == -1) {
      __return_storage_ptr__->result = END;
      (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->error)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->error).field_2;
      (__return_storage_ptr__->error)._M_string_length = 0;
      (__return_storage_ptr__->error).field_2._M_local_buf[0] = '\0';
      goto LAB_00115989;
    }
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x2a:
  case 0x2b:
switchD_001151ef_caseD_24:
    tolower(iVar5);
    std::__cxx11::string::push_back(cVar12);
    iVar5 = std::istream::peek();
    while (bVar4 = is_delimiter(iVar5), !bVar4) {
      tolower(iVar5);
      std::__cxx11::string::push_back(cVar12);
      std::istream::get();
      iVar5 = std::istream::peek();
    }
    aVar7 = identifier_type((string *)s);
    *(ast_type_t *)&this[1]._vptr__Sp_counted_base = aVar7;
  }
  __return_storage_ptr__->result = OK;
  (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = this;
LAB_00115972:
  (__return_storage_ptr__->error)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).field_2;
  (__return_storage_ptr__->error)._M_string_length = 0;
  (__return_storage_ptr__->error).field_2._M_local_buf[0] = '\0';
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_00115989:
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
  }
  if (p_Stack_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  return __return_storage_ptr__;
}

Assistant:

ParseResult read_object(std::istream &is)
{
    auto o = std::make_shared<ASTNode>();
    skip_whitespace(is);
    int c = is.get();
    std::string charname;
    ParseResult result;
    switch(c)
    {
        case EOF:
            return ParseResult();
        case ')':
        case ']':
            return ParseResult("Invalid syntax");
        case '"':
            o->type = ast_type_t::STRING;
            c = is.get();
            while(c != EOF && c != '"')
            {
                if(c == '\\')
                {
                    c = is.get();
                    if(c == 'n')
                        o->value.push_back('\n');
                    else if(c == 't')
                        o->value.push_back('\t');
                    else if(c == 'f')
                        o->value.push_back('\f');
                    else if('0' <= c && c <= '7')
                    {
                        std::string oct;
                        for(int i = 0; i < 2; ++i)
                        {
                            oct.push_back(c);
                            c = is.get();
                            if(!('0' <= c && c <= '7'))
                                return ParseResult("Invalid escape sequence: \\" + oct + char(c));
                        }
                        oct.push_back(c);
                        o->value.push_back(parse_oct_char(oct));
                    }
                    else
                        o->value.push_back(c);
                }
                else
                    o->value.push_back(c);
                c = is.get();
            }
            if(c == EOF)
                return ParseResult("Unclosed string literal");
            return o;
        case '(':
        case '[':
            if((result = read_list(is, o, c == '[')).result != parse_result_t::OK)
                return result;
            return o;
        case '\'':
            if((result = read_quoted(is, o, "quote")).result != parse_result_t::OK)
                return result;
            return o;
        case '`':
            if((result = read_quoted(is, o, "quasiquote")).result != parse_result_t::OK)
                return result;
            return o;
        case ',':
            if(is.peek() == '@')
            {
                is.get();
                if((result = read_quoted(is, o, "unquote-splicing")).result != parse_result_t::OK)
                    return result;
            }
            else
            {
                if((result = read_quoted(is, o, "unquote")).result != parse_result_t::OK)
                    return result;
            }
            return o;
        case '#':
            c = tolower(is.get());
            switch(c)
            {
                case 't':
                    o->type = ast_type_t::BOOL;
                    o->value = "t";
                    return o;
                case 'f':
                    o->type = ast_type_t::BOOL;
                    o->value = "f";
                    return o;
                case '\\':
                    o->type = ast_type_t::CHAR;
                    c = is.get();
                    if(c == EOF)
                        return ParseResult("Invalid character");
                    charname.clear();
                    charname.push_back(c);
                    c = is.peek();
                    while(!is_delimiter(c))
                    {
                        charname.push_back(c);
                        is.get();
                        c = is.peek();
                    }
                    o->value = normalize_char_name(charname);
                    if(o->value.empty())
                        return ParseResult("Invalid character: #\\" + charname);
                    return o;
                case '(':
                case '[':
                    if((result = read_list(is, o, c == '[')).result != parse_result_t::OK)
                        return result;
                    o->type = ast_type_t::VECTOR;
                    return o;
                case '!':
                    o->value = "#!";
                    c = is.get();
                    break;
                default:
                    return ParseResult(std::string("Invalid sequence: #") + char(c));
            }
        default:
            o->value.push_back(tolower(c));
            c = is.peek();
            while(!is_delimiter(c))
            {
                o->value.push_back(tolower(c));
                is.get();
                c = is.peek();
            }
            o->type = identifier_type(o->value);
            return o;
    }
}